

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int addk(FuncState *fs,TValue *k,TValue *v)

{
  int iVar1;
  lua_State *L;
  GCObject *o;
  int iVar2;
  TValue *i_o;
  TValue *pTVar3;
  Table *pTVar4;
  Node **ppNVar5;
  long lVar6;
  TValue *o2;
  
  L = fs->L;
  pTVar3 = luaH_set(L,fs->h,k);
  if (pTVar3->tt == 3) {
    iVar2 = (int)(pTVar3->value).n;
  }
  else {
    o = (GCObject *)fs->f;
    lVar6 = (long)(o->p).sizek;
    (pTVar3->value).n = (double)fs->nk;
    pTVar3->tt = 3;
    iVar2 = (o->p).sizek;
    if (iVar2 <= fs->nk) {
      pTVar4 = (Table *)luaM_growaux_(L,(o->h).metatable,&(o->p).sizek,0x10,0x3ffff,
                                      "constant table overflow");
      (o->h).metatable = pTVar4;
      iVar2 = (o->p).sizek;
    }
    pTVar4 = (o->h).metatable;
    ppNVar5 = (Node **)(&pTVar4->tt + lVar6 * 0x10);
    for (; lVar6 < iVar2; lVar6 = lVar6 + 1) {
      *(undefined4 *)ppNVar5 = 0;
      ppNVar5 = ppNVar5 + 2;
    }
    iVar2 = fs->nk;
    *(Value *)(&pTVar4->next + (long)iVar2 * 2) = v->value;
    iVar1 = v->tt;
    *(int *)(&pTVar4->tt + (long)iVar2 * 0x10) = iVar1;
    if (((3 < iVar1) && (((((v->value).gc)->gch).marked & 3) != 0)) && (((o->gch).marked & 4) != 0))
    {
      luaC_barrierf(L,o,(v->value).gc);
    }
    iVar2 = fs->nk;
    fs->nk = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int addk(FuncState*fs,TValue*k,TValue*v){
lua_State*L=fs->L;
TValue*idx=luaH_set(L,fs->h,k);
Proto*f=fs->f;
int oldsize=f->sizek;
if(ttisnumber(idx)){
return cast_int(nvalue(idx));
}
else{
setnvalue(idx,cast_num(fs->nk));
luaM_growvector(L,f->k,fs->nk,f->sizek,TValue,
((1<<(9+9))-1),"constant table overflow");
while(oldsize<f->sizek)setnilvalue(&f->k[oldsize++]);
setobj(L,&f->k[fs->nk],v);
luaC_barrier(L,f,v);
return fs->nk++;
}
}